

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glx_context.c
# Opt level: O0

void makeContextCurrentGLX(_GLFWwindow *window)

{
  int iVar1;
  void *in_RDI;
  
  if (in_RDI == (void *)0x0) {
    iVar1 = (*_glfw.glx.MakeCurrent)(_glfw.x11.display,0,(GLXContext)0x0);
    if (iVar1 == 0) {
      _glfwInputError(0x10008,"GLX: Failed to clear current context");
      return;
    }
  }
  else {
    iVar1 = (*_glfw.glx.MakeCurrent)
                      (_glfw.x11.display,*(GLXDrawable *)((long)in_RDI + 0x278),
                       *(GLXContext *)((long)in_RDI + 0x270));
    if (iVar1 == 0) {
      _glfwInputError(0x10008,"GLX: Failed to make context current");
      return;
    }
  }
  _glfwPlatformSetTls((_GLFWtls *)window,in_RDI);
  return;
}

Assistant:

static void makeContextCurrentGLX(_GLFWwindow* window)
{
    if (window)
    {
        if (!glXMakeCurrent(_glfw.x11.display,
                            window->context.glx.window,
                            window->context.glx.handle))
        {
            _glfwInputError(GLFW_PLATFORM_ERROR,
                            "GLX: Failed to make context current");
            return;
        }
    }
    else
    {
        if (!glXMakeCurrent(_glfw.x11.display, None, NULL))
        {
            _glfwInputError(GLFW_PLATFORM_ERROR,
                            "GLX: Failed to clear current context");
            return;
        }
    }

    _glfwPlatformSetTls(&_glfw.contextSlot, window);
}